

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O2

void __thiscall
dit::anon_unknown_0::ConstantInterpolationTest::~ConstantInterpolationTest
          (ConstantInterpolationTest *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ConstantInterpolationTest_0027ec70;
  std::
  vector<dit::(anonymous_namespace)::ConstantInterpolationTest::SubCase,_std::allocator<dit::(anonymous_namespace)::ConstantInterpolationTest::SubCase>_>
  ::~vector(&this->m_cases);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ConstantInterpolationTest (tcu::TestContext& testCtx)
		: tcu::TestCase(testCtx, "const_interpolation", "Constant value interpolation")
	{
		const int supportedMsaaLevels[] = {1, 2, 4, 8, 16};

		for (int msaaNdx = 0; msaaNdx < DE_LENGTH_OF_ARRAY(supportedMsaaLevels); msaaNdx++)
		{
			const int numSamples = supportedMsaaLevels[msaaNdx];
			{
				SubCase c;
				c.rtSize	= tcu::IVec3(128, 128, numSamples);
				c.vtx[0]	= tcu::Vec4(-1.0f, -1.0f, 0.5f, 1.0f);
				c.vtx[1]	= tcu::Vec4(-1.0f, +1.0f, 0.5f, 1.0f);
				c.vtx[2]	= tcu::Vec4(+1.0f, -1.0f, 0.5f, 1.0f);
				c.varying	= tcu::Vec4(0.0f, 1.0f, 8.0f, -8.0f);
				m_cases.push_back(c);
			}

			{
				SubCase c;
				c.rtSize	= tcu::IVec3(128, 128, numSamples);
				c.vtx[0]	= tcu::Vec4(-1.0f, +1.0f, 0.5f, 1.0f);
				c.vtx[1]	= tcu::Vec4(+1.0f, -1.0f, 0.5f, 1.0f);
				c.vtx[2]	= tcu::Vec4(+1.0f, +1.0f, 0.5f, 1.0f);
				c.varying	= tcu::Vec4(0.0f, 1.0f, 8.0f, -8.0f);
				m_cases.push_back(c);
			}
			{
				SubCase c;
				c.rtSize	= tcu::IVec3(129, 113, numSamples);
				c.vtx[0]	= tcu::Vec4(-1.0f, -1.0f, 0.5f, 1.0f);
				c.vtx[1]	= tcu::Vec4(-1.0f, +1.0f, 0.5f, 1.0f);
				c.vtx[2]	= tcu::Vec4(+1.0f, -1.0f, 0.5f, 1.0f);
				c.varying	= tcu::Vec4(0.0f, 1.0f, 8.0f, -8.0f);
				m_cases.push_back(c);
			}
			{
				SubCase c;
				c.rtSize	= tcu::IVec3(107, 131, numSamples);
				c.vtx[0]	= tcu::Vec4(-1.0f, +1.0f, 0.5f, 1.0f);
				c.vtx[1]	= tcu::Vec4(+1.0f, -1.0f, 0.5f, 1.0f);
				c.vtx[2]	= tcu::Vec4(+1.0f, +1.0f, 0.5f, 1.0f);
				c.varying	= tcu::Vec4(0.0f, 1.0f, 8.0f, -8.0f);
				m_cases.push_back(c);
			}
		}

		{
			de::Random rnd(0x89423f);
			for (int ndx = 0; ndx < 25; ndx++)
			{
				const float	depth	= rnd.getFloat()*2.0f - 1.0f;
				SubCase		c;

				c.rtSize.x() = rnd.getInt(16, 256);
				c.rtSize.y() = rnd.getInt(16, 256);
				c.rtSize.z() = rnd.choose<int>(DE_ARRAY_BEGIN(supportedMsaaLevels), DE_ARRAY_END(supportedMsaaLevels));

				for (int vtxNdx = 0; vtxNdx < DE_LENGTH_OF_ARRAY(c.vtx); vtxNdx++)
				{
					c.vtx[vtxNdx].x() = rnd.getFloat()*2.0f - 1.0f;
					c.vtx[vtxNdx].y() = rnd.getFloat()*2.0f - 1.0f;
					c.vtx[vtxNdx].z() = depth;
					c.vtx[vtxNdx].w() = 1.0f;
				}

				for (int compNdx = 0; compNdx < 4; compNdx++)
				{
					float v;
					do
					{
						v = tcu::Float32(rnd.getUint32()).asFloat();
					} while (deFloatIsInf(v) || deFloatIsNaN(v));
					c.varying[compNdx] = v;
				}
				m_cases.push_back(c);
			}
		}
	}